

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSplit.c
# Opt level: O1

int Spl_ManFindGoodCand(Spl_Man_t *p)

{
  uint *puVar1;
  uint uVar2;
  int iObj;
  int *piVar3;
  Vec_Bit_t *pVVar4;
  byte bVar5;
  int iVar6;
  Vec_Int_t *pVVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  
  pVVar7 = p->vInputs;
  if (0 < pVVar7->nSize) {
    piVar3 = pVVar7->pArray;
    pVVar4 = p->vMarksIn;
    lVar9 = 0;
    do {
      uVar2 = piVar3[lVar9];
      if (((int)uVar2 < 0) || (pVVar4->nSize <= (int)uVar2)) goto LAB_007d32f5;
      puVar1 = (uint *)(pVVar4->pArray + (uVar2 >> 5));
      *puVar1 = *puVar1 | 1 << ((byte)uVar2 & 0x1f);
      lVar9 = lVar9 + 1;
    } while (lVar9 < pVVar7->nSize);
  }
  pVVar7 = p->vCands;
  if (pVVar7->nSize < 1) {
    iVar8 = 0;
  }
  else {
    lVar9 = 0;
    iVar10 = -1;
    iVar8 = 0;
    do {
      iObj = pVVar7->pArray[lVar9];
      iVar6 = Spl_ManCountMarkedFanins(p->pGia,iObj,p->vMarksIn);
      if (iVar10 < iVar6) {
        iVar8 = iObj;
      }
      if (iVar10 <= iVar6) {
        iVar10 = iVar6;
      }
      lVar9 = lVar9 + 1;
      pVVar7 = p->vCands;
    } while (lVar9 < pVVar7->nSize);
  }
  pVVar7 = p->vInputs;
  if (0 < pVVar7->nSize) {
    piVar3 = pVVar7->pArray;
    pVVar4 = p->vMarksIn;
    lVar9 = 0;
    do {
      uVar2 = piVar3[lVar9];
      if (((int)uVar2 < 0) || (pVVar4->nSize <= (int)uVar2)) {
LAB_007d32f5:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecBit.h"
                      ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
      }
      bVar5 = (byte)uVar2 & 0x1f;
      puVar1 = (uint *)(pVVar4->pArray + (uVar2 >> 5));
      *puVar1 = *puVar1 & (-2 << bVar5 | 0xfffffffeU >> 0x20 - bVar5);
      lVar9 = lVar9 + 1;
    } while (lVar9 < pVVar7->nSize);
  }
  return iVar8;
}

Assistant:

int Spl_ManFindGoodCand( Spl_Man_t * p )
{
    int i, iObj;
    int Res = 0, InCount, InCountMax = -1; 
    // mark leaves
    Vec_IntForEachEntry( p->vInputs, iObj, i )
        Vec_BitWriteEntry( p->vMarksIn, iObj, 1 );
    // find candidate with maximum input overlap
    Vec_IntForEachEntry( p->vCands, iObj, i )
    {
        InCount = Spl_ManCountMarkedFanins( p->pGia, iObj, p->vMarksIn );
        if ( InCountMax < InCount )
        {
            InCountMax = InCount;
            Res = iObj;
        }
    }
    // unmark leaves
    Vec_IntForEachEntry( p->vInputs, iObj, i )
        Vec_BitWriteEntry( p->vMarksIn, iObj, 0 );
    return Res;
}